

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesToArray
          (MessageGenerator *this,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  Printer *pPVar1;
  bool bVar2;
  MessageOptions *this_00;
  Sub *local_4a0;
  basic_string_view<char,_std::char_traits<char>_> local_438;
  undefined1 local_421;
  anon_class_16_2_fd512ddd_for_cb local_420;
  allocator<char> local_409;
  string local_408;
  anon_class_16_2_fd512ddd_for_cb local_3e8;
  allocator<char> local_3d1;
  string local_3d0;
  anon_class_16_2_fd512ddd_for_cb local_3b0;
  allocator<char> local_399;
  string local_398;
  char *local_378 [3];
  allocator<char> local_359;
  string local_358;
  Sub *local_338;
  Sub local_330;
  Sub local_278;
  Sub local_1c0;
  Sub local_108;
  iterator local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_40;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  Printer *local_18;
  Printer *p_local;
  MessageGenerator *this_local;
  
  local_18 = p;
  p_local = (Printer *)this;
  bVar2 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  if (!bVar2) {
    this_00 = Descriptor::options(this->descriptor_);
    bVar2 = MessageOptions::message_set_wire_format(this_00);
    pPVar1 = local_18;
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_28,
                 "\n#if defined(PROTOBUF_CUSTOM_VTABLE)\n      $uint8$* $nonnull$ $classname$::_InternalSerialize(\n          const $pb$::MessageLite& base, $uint8$* $nonnull$ target,\n          $pb$::io::EpsCopyOutputStream* $nonnull$ stream) {\n        const $classname$& this_ = static_cast<const $classname$&>(base);\n#else   // PROTOBUF_CUSTOM_VTABLE\n      $uint8$* $nonnull$ $classname$::_InternalSerialize(\n          $uint8$* $nonnull$ target,\n          $pb$::io::EpsCopyOutputStream* $nonnull$ stream) const {\n        const $classname$& this_ = *this;\n#endif  // PROTOBUF_CUSTOM_VTABLE\n        $annotate_serialize$ target =\n            this_.$extensions$\n                .InternalSerializeMessageSetWithCachedSizesToArray(\n                    &default_instance(), target, stream);\n        target = ::_pbi::InternalSerializeUnknownMessageSetItemsToArray(\n            this_.$unknown_fields$, target, stream);\n        return target;\n      }\n    "
                );
      protobuf::io::Printer::SourceLocation::current();
      protobuf::io::Printer::Emit(pPVar1,local_28._M_len,local_28._M_str);
    }
    else {
      local_421 = 1;
      local_338 = &local_330;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_358,"debug_cond",&local_359);
      bVar2 = cpp::anon_unknown_0::ShouldSerializeInOrder(this->descriptor_,&this->options_);
      local_378[0] = "defined(NDEBUG)";
      if (bVar2) {
        local_378[0] = "1";
      }
      protobuf::io::Printer::Sub::Sub<char_const*>(&local_330,&local_358,local_378);
      local_338 = &local_278;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"ndebug",&local_399);
      local_3b0.p = &local_18;
      local_3b0.this = this;
      protobuf::io::Printer::Sub::
      Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesToArray(google::protobuf::io::Printer*)::__0>
                (&local_278,&local_398,&local_3b0);
      local_338 = &local_1c0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"debug",&local_3d1);
      local_3e8.p = &local_18;
      local_3e8.this = this;
      protobuf::io::Printer::Sub::
      Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesToArray(google::protobuf::io::Printer*)::__1>
                (&local_1c0,&local_3d0,&local_3e8);
      local_338 = &local_108;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,"ifdef",&local_409);
      local_420.p = &local_18;
      local_420.this = this;
      protobuf::io::Printer::Sub::
      Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesToArray(google::protobuf::io::Printer*)::__2>
                (&local_108,&local_408,&local_420);
      local_421 = 0;
      local_50 = &local_330;
      local_48 = 4;
      v._M_len = 4;
      v._M_array = local_50;
      absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
      Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
                ((Span<google::protobuf::io::Printer::Sub_const> *)local_40._M_local_buf,v);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_438,
                 "\n#if defined(PROTOBUF_CUSTOM_VTABLE)\n        $uint8$* $nonnull$ $classname$::_InternalSerialize(\n            const $pb$::MessageLite& base, $uint8$* $nonnull$ target,\n            $pb$::io::EpsCopyOutputStream* $nonnull$ stream) {\n          const $classname$& this_ = static_cast<const $classname$&>(base);\n#else   // PROTOBUF_CUSTOM_VTABLE\n        $uint8$* $nonnull$ $classname$::_InternalSerialize(\n            $uint8$* $nonnull$ target,\n            $pb$::io::EpsCopyOutputStream* $nonnull$ stream) const {\n          const $classname$& this_ = *this;\n#endif  // PROTOBUF_CUSTOM_VTABLE\n          $annotate_serialize$;\n          // @@protoc_insertion_point(serialize_to_array_start:$full_name$)\n          $ifdef$;\n          // @@protoc_insertion_point(serialize_to_array_end:$full_name$)\n          return target;\n        }\n      "
                );
      protobuf::io::Printer::SourceLocation::current();
      protobuf::io::Printer::Emit
                (pPVar1,local_40._M_allocated_capacity,local_40._8_8_,local_438._M_len,
                 local_438._M_str);
      local_4a0 = (Sub *)&local_50;
      do {
        local_4a0 = local_4a0 + -1;
        protobuf::io::Printer::Sub::~Sub(local_4a0);
      } while (local_4a0 != &local_330);
      std::__cxx11::string::~string((string *)&local_408);
      std::allocator<char>::~allocator(&local_409);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::allocator<char>::~allocator(&local_3d1);
      std::__cxx11::string::~string((string *)&local_398);
      std::allocator<char>::~allocator(&local_399);
      std::__cxx11::string::~string((string *)&local_358);
      std::allocator<char>::~allocator(&local_359);
    }
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSerializeWithCachedSizesToArray(io::Printer* p) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    p->Emit(R"cc(
#if defined(PROTOBUF_CUSTOM_VTABLE)
      $uint8$* $nonnull$ $classname$::_InternalSerialize(
          const $pb$::MessageLite& base, $uint8$* $nonnull$ target,
          $pb$::io::EpsCopyOutputStream* $nonnull$ stream) {
        const $classname$& this_ = static_cast<const $classname$&>(base);
#else   // PROTOBUF_CUSTOM_VTABLE
      $uint8$* $nonnull$ $classname$::_InternalSerialize(
          $uint8$* $nonnull$ target,
          $pb$::io::EpsCopyOutputStream* $nonnull$ stream) const {
        const $classname$& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
        $annotate_serialize$ target =
            this_.$extensions$
                .InternalSerializeMessageSetWithCachedSizesToArray(
                    &default_instance(), target, stream);
        target = ::_pbi::InternalSerializeUnknownMessageSetItemsToArray(
            this_.$unknown_fields$, target, stream);
        return target;
      }
    )cc");
    return;
  }

  p->Emit(
      {
          {"debug_cond", ShouldSerializeInOrder(descriptor_, options_)
                             ? "1"
                             : "defined(NDEBUG)"},
          {"ndebug", [&] { GenerateSerializeWithCachedSizesBody(p); }},
          {"debug", [&] { GenerateSerializeWithCachedSizesBodyShuffled(p); }},
          {"ifdef",
           [&] {
             if (ShouldSerializeInOrder(descriptor_, options_)) {
               p->Emit("$ndebug$");
             } else {
               p->Emit(R"cc(
#ifdef NDEBUG
                 $ndebug$;
#else   // NDEBUG
                 $debug$;
#endif  // !NDEBUG
               )cc");
             }
           }},
      },
      R"cc(
#if defined(PROTOBUF_CUSTOM_VTABLE)
        $uint8$* $nonnull$ $classname$::_InternalSerialize(
            const $pb$::MessageLite& base, $uint8$* $nonnull$ target,
            $pb$::io::EpsCopyOutputStream* $nonnull$ stream) {
          const $classname$& this_ = static_cast<const $classname$&>(base);
#else   // PROTOBUF_CUSTOM_VTABLE
        $uint8$* $nonnull$ $classname$::_InternalSerialize(
            $uint8$* $nonnull$ target,
            $pb$::io::EpsCopyOutputStream* $nonnull$ stream) const {
          const $classname$& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
          $annotate_serialize$;
          // @@protoc_insertion_point(serialize_to_array_start:$full_name$)
          $ifdef$;
          // @@protoc_insertion_point(serialize_to_array_end:$full_name$)
          return target;
        }
      )cc");
}